

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O1

void __thiscall Expr_fraction_Test::TestBody(Expr_fraction_Test *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> ex;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _func_int **message;
  ExprPtr EVar1;
  AssertionResult gtest_ar;
  ExprPtr expr;
  undefined1 local_60 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  string local_50;
  AssertHelper local_30;
  impl local_28 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  local_50._M_dataplus._M_p = (pointer)0x0;
  local_50._M_string_length = (size_type)operator_new(0x50);
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_string_length)->_M_use_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_string_length)->_M_weak_count = 1;
  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_string_length)->
  _vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00253718;
  local_50._M_dataplus._M_p = (pointer)(local_50._M_string_length + 0x10);
  *(undefined4 *)
   &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_50._M_string_length + 0x10))->
    _vptr__Sp_counted_base = 5;
  *(undefined1 *)
   &((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_50._M_string_length + 0x40))->
    _M_use_count = 0;
  local_60 = (undefined1  [8])0x0;
  local_58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x50);
  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58._M_pi)->
  _M_string_length = 0x100000001;
  (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58._M_pi)->
  _M_dataplus)._M_p = (pointer)&PTR___Sp_counted_ptr_inplace_00253718;
  local_60 = (undefined1  [8])
             &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58._M_pi)
              ->field_2;
  *(undefined4 *)
   &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58._M_pi)->field_2 =
       8;
  *(undefined1 *)
   &((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
    ((long)local_58._M_pi + 0x40))->_M_string_length = 0;
  EVar1 = mathiu::impl::operator/(local_28,(ExprPtr *)&local_50,(ExprPtr *)local_60);
  ex = EVar1.super___shared_ptr<const_mathiu::impl::Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
       _M_pi;
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58._M_pi);
    ex._M_pi = extraout_RDX;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_string_length);
    ex._M_pi = extraout_RDX_00;
  }
  mathiu::impl::toString_abi_cxx11_(&local_50,local_28,(ExprPtr *)ex._M_pi);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            ((internal *)local_60,"toString(expr)","\"5/8\"",&local_50,(char (*) [4])"5/8");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_60[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58._M_pi ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = (_func_int **)0x20d5b4;
    }
    else {
      message = (_func_int **)((_Alloc_hider *)&(local_58._M_pi)->_vptr__Sp_counted_base)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/BowenFu[P]mathiu/test/mathiu/expr.cpp"
               ,0x35,(char *)message);
    testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_30);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._M_dataplus._M_p !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      (**(code **)(*(long *)local_50._M_dataplus._M_p + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58._M_pi !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58._M_pi
                );
  }
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  return;
}

Assistant:

TEST(Expr, fraction)
{
    auto expr = 5_i / 8_i;
    EXPECT_EQ(toString(expr), "5/8");
}